

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int NV12Mirror(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,uint8_t *dst_y,
              int dst_stride_y,uint8_t *dst_uv,int dst_stride_uv,int width,int height)

{
  int iVar1;
  uint height_00;
  
  iVar1 = -1;
  if ((height != 0 && 0 < width) &&
      (dst_uv != (uint8_t *)0x0 && (src_uv != (uint8_t *)0x0 && src_y != (uint8_t *)0x0))) {
    if (height < 0) {
      iVar1 = -height;
      height_00 = 1U - height >> 1;
      src_y = src_y + ~height * src_stride_y;
      src_uv = src_uv + (int)((height_00 - 1) * src_stride_uv);
      src_stride_y = -src_stride_y;
      src_stride_uv = -src_stride_uv;
    }
    else {
      height_00 = height + 1 >> 1;
      iVar1 = height;
    }
    if (dst_y != (uint8_t *)0x0) {
      MirrorPlane(src_y,src_stride_y,dst_y,dst_stride_y,width,iVar1);
    }
    MirrorUVPlane(src_uv,src_stride_uv,dst_uv,dst_stride_uv,width + 1 >> 1,height_00);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int NV12Mirror(const uint8_t* src_y,
               int src_stride_y,
               const uint8_t* src_uv,
               int src_stride_uv,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_uv,
               int dst_stride_uv,
               int width,
               int height) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src_y || !src_uv || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    src_y = src_y + (height - 1) * src_stride_y;
    src_uv = src_uv + (halfheight - 1) * src_stride_uv;
    src_stride_y = -src_stride_y;
    src_stride_uv = -src_stride_uv;
  }

  if (dst_y) {
    MirrorPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  }
  MirrorUVPlane(src_uv, src_stride_uv, dst_uv, dst_stride_uv, halfwidth,
                halfheight);
  return 0;
}